

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float64_to_float32_sparc(float64 a,float_status *s)

{
  FloatParts FVar1;
  
  FVar1._8_8_ = (ulong)((uint)(a >> 0x34) & 0x7ff) | a >> 0x17 & 0x10000000000;
  FVar1.frac = a & 0xfffffffffffff;
  FVar1 = sf_canonicalize(FVar1,&float64_params,s);
  FVar1 = float_to_float(FVar1,&float32_params,s);
  FVar1 = round_canonical(FVar1,s,&float32_params);
  return (uint)FVar1.frac & 0x7fffff | (FVar1.exp & 0xffU) << 0x17 |
         (uint)(FVar1._8_8_ >> 9) & 0x80000000;
}

Assistant:

float32 float64_to_float32(float64 a, float_status *s)
{
    FloatParts p = float64_unpack_canonical(a, s);
    FloatParts pr = float_to_float(p, &float32_params, s);
    return float32_round_pack_canonical(pr, s);
}